

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O1

void cmFortranModuleAppendUpperLower(string *mod,string *mod_upper,string *mod_lower)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  string local_a0;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60 [2];
  long local_50 [2];
  string local_40;
  
  local_a0._M_string_length = (size_type)(mod->_M_dataplus)._M_p;
  local_a0._M_dataplus._M_p = (pointer)mod->_M_string_length;
  if ((local_a0._M_dataplus._M_p < (pointer)0x4) ||
     (__str._M_str = ".mod", __str._M_len = 4,
     iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                       ((basic_string_view<char,_std::char_traits<char>_> *)&local_a0,
                        (size_type)(local_a0._M_dataplus._M_p + -4),4,__str), iVar1 != 0)) {
    local_a0._M_string_length = (size_type)(mod->_M_dataplus)._M_p;
    local_a0._M_dataplus._M_p = (pointer)mod->_M_string_length;
    if ((local_a0._M_dataplus._M_p < (pointer)0x4) ||
       (__str_00._M_str = ".sub", __str_00._M_len = 4,
       iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                         ((basic_string_view<char,_std::char_traits<char>_> *)&local_a0,
                          (size_type)(local_a0._M_dataplus._M_p + -4),4,__str_00), iVar1 != 0)) {
      local_a0._M_string_length = (size_type)(mod->_M_dataplus)._M_p;
      local_a0._M_dataplus._M_p = (pointer)mod->_M_string_length;
      if ((pointer)0x4 < local_a0._M_dataplus._M_p) {
        __str_01._M_str = ".smod";
        __str_01._M_len = 5;
        std::basic_string_view<char,_std::char_traits<char>_>::compare
                  ((basic_string_view<char,_std::char_traits<char>_> *)&local_a0,
                   (size_type)(local_a0._M_dataplus._M_p + -5),5,__str_01);
      }
    }
  }
  std::__cxx11::string::substr((ulong)&local_a0,(ulong)mod);
  std::__cxx11::string::substr((ulong)local_60,(ulong)mod);
  cmsys::SystemTools::UpperCase(&local_40,&local_a0);
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_40,(ulong)local_60[0]);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_70 = *plVar3;
    lStack_68 = plVar2[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar3;
    local_80 = (long *)*plVar2;
  }
  local_78 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)mod_upper,(ulong)local_80);
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_append((char *)mod_lower,(ulong)(mod->_M_dataplus)._M_p);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void cmFortranModuleAppendUpperLower(std::string const& mod,
                                            std::string& mod_upper,
                                            std::string& mod_lower)
{
  std::string::size_type ext_len = 0;
  if (cmHasLiteralSuffix(mod, ".mod") || cmHasLiteralSuffix(mod, ".sub")) {
    ext_len = 4;
  } else if (cmHasLiteralSuffix(mod, ".smod")) {
    ext_len = 5;
  }
  std::string const& name = mod.substr(0, mod.size() - ext_len);
  std::string const& ext = mod.substr(mod.size() - ext_len);
  mod_upper += cmSystemTools::UpperCase(name) + ext;
  mod_lower += mod;
}